

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O1

bool spvtools::opt::(anonymous_namespace)::
     ReplaceTrinaryMid<(GLSLstd450)37,(GLSLstd450)40,(GLSLstd450)43>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint *puVar1;
  IRContext *pIVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  array<signed_char,_4UL> aVar6;
  array<signed_char,_4UL> aVar7;
  uint uVar8;
  OperandList new_operands;
  InstructionBuilder ir_builder;
  undefined1 local_e8 [24];
  uint local_d0 [2];
  uint *local_c8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  array<signed_char,_4UL> local_8c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_88;
  Instruction *local_68;
  Instruction *local_60;
  IRContext *local_58;
  InstructionBuilder local_50;
  
  if ((ctx->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(ctx);
  }
  aVar6._M_elems =
       (_Type)((ctx->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
              extinst_importid_GLSLstd450_;
  if (aVar6._M_elems == (_Type)0x0) {
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"GLSL.std.450","");
    IRContext::AddExtInstImport(ctx,(string *)local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if ((ctx->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(ctx);
    }
    aVar6._M_elems =
         (_Type)((ctx->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
                extinst_importid_GLSLstd450_;
  }
  local_50.parent_ = IRContext::get_instr_block(ctx,inst);
  local_50.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  uVar8 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar8 = (uint)inst->has_result_id_;
  }
  local_58 = ctx;
  local_50.context_ = ctx;
  local_50.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
  local_8c._M_elems = (_Type)Instruction::GetSingleWordOperand(inst,uVar8 + 2);
  uVar8 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar8 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar8 + 3);
  uVar8 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar8 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar8 | 4);
  uVar5 = 0;
  if (inst->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(inst,0);
  }
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  local_e8._0_8_ = operator_new(8);
  local_e8._8_8_ = local_e8._0_8_ + 8;
  *(ulong *)local_e8._0_8_ = CONCAT44(uVar4,uVar3);
  local_e8._16_8_ = local_e8._8_8_;
  local_68 = InstructionBuilder::AddNaryExtendedInstruction
                       (&local_50,uVar5,(uint32_t)aVar6._M_elems,0x25,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
  }
  uVar5 = 0;
  if (inst->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(inst,0);
  }
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (_func_int **)0x0;
  local_e8._16_8_ = 0;
  local_e8._0_8_ = operator_new(8);
  local_e8._8_8_ = local_e8._0_8_ + 8;
  *(ulong *)local_e8._0_8_ = CONCAT44(uVar4,uVar3);
  local_e8._16_8_ = local_e8._8_8_;
  local_60 = InstructionBuilder::AddNaryExtendedInstruction
                       (&local_50,uVar5,(uint32_t)aVar6._M_elems,0x28,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
  }
  local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (uint *)(local_b8 + 0x10);
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._8_8_ = 1;
  local_e8._0_4_ = 1;
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  local_e8._16_8_ = 0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c8 = local_d0;
  local_b8._16_4_ = aVar6._M_elems;
  local_b8._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_e8);
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8[0x10] = '+';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8._8_8_ = 1;
  local_e8._0_4_ = 7;
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  local_e8._16_8_ = 0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c8 = local_d0;
  local_b8._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_e8);
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8[0x10] = local_8c._M_elems[0];
  local_b8[0x11] = local_8c._M_elems[1];
  local_b8[0x12] = local_8c._M_elems[2];
  local_b8[0x13] = local_8c._M_elems[3];
  local_b8._8_8_ = 1;
  local_e8._0_4_ = 1;
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  local_e8._16_8_ = 0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c8 = local_d0;
  local_b8._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_e8);
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  aVar6._M_elems[0] = '\0';
  aVar6._M_elems[1] = '\0';
  aVar6._M_elems[2] = '\0';
  aVar6._M_elems[3] = '\0';
  if (local_68->has_result_id_ == true) {
    aVar6._M_elems = (_Type)Instruction::GetSingleWordOperand(local_68,(uint)local_68->has_type_id_)
    ;
  }
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._8_8_ = 1;
  local_e8._0_4_ = 1;
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  local_e8._16_8_ = 0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c8 = local_d0;
  local_b8._16_4_ = aVar6._M_elems;
  local_b8._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_e8);
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  aVar7._M_elems[0] = '\0';
  aVar7._M_elems[1] = '\0';
  aVar7._M_elems[2] = '\0';
  aVar7._M_elems[3] = '\0';
  if (local_60->has_result_id_ == true) {
    aVar7._M_elems = (_Type)Instruction::GetSingleWordOperand(local_60,(uint)local_60->has_type_id_)
    ;
  }
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._8_8_ = 1;
  local_e8._0_4_ = 1;
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  local_e8._16_8_ = 0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c8 = local_d0;
  local_b8._16_4_ = aVar7._M_elems;
  local_b8._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_e8);
  local_e8._8_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  pIVar2 = local_58;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  uVar8 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar8 = (uint)inst->has_result_id_;
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
            (&inst->operands_,
             (Operand *)
             ((long)((((inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                    0xfffffffffffffffa) + (ulong)(uVar8 * 0x30)),
             (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
             &inst->operands_,
             (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             local_88.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_88.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::UpdateDefUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_88);
  return true;
}

Assistant:

bool ReplaceTrinaryMid(IRContext* ctx, Instruction* inst,
                       const std::vector<const analysis::Constant*>&) {
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t op1 = inst->GetSingleWordInOperand(2);
  uint32_t op2 = inst->GetSingleWordInOperand(3);
  uint32_t op3 = inst->GetSingleWordInOperand(4);

  Instruction* min = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, static_cast<uint32_t>(min_opcode),
      {op2, op3});
  Instruction* max = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, static_cast<uint32_t>(max_opcode),
      {op2, op3});

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl405_ext_inst_id}});
  new_operands.push_back({SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                          {static_cast<uint32_t>(clamp_opcode)}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {op1}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {min->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {max->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}